

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void usage(char **argv)

{
  ostream *poVar1;
  char **argv_local;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Usage: ");
  poVar1 = std::operator<<(poVar1,*argv);
  poVar1 = std::operator<<(poVar1," <file>");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void usage(char** argv)
{
    std::cout << "Usage: " << argv[0] << " <file>" << std::endl;
}